

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O1

void __thiscall
Js::ByteCodeWriter::Reg3(ByteCodeWriter *this,OpCode op,RegSlot R0,RegSlot R1,RegSlot R2)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  Type TVar4;
  RegSlot R0_00;
  RegSlot R1_00;
  RegSlot R2_00;
  undefined4 *puVar5;
  RegSlot local_40;
  RegSlot local_3c;
  RegSlot local_38;
  Type local_34;
  OpCode local_32 [4];
  OpCode op_local;
  
  local_32[0] = op;
  CheckOpen(this);
  CheckOp(this,local_32[0],(OpLayoutType)0x4);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(local_32[0]);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x1b2,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) goto LAB_0089b01b;
    *puVar5 = 0;
  }
  if (R0 != 0xffffffff) {
    if (this->m_functionWrite == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar2) goto LAB_0089b01b;
      *puVar5 = 0;
    }
    R0_00 = FunctionBody::MapRegSlot(this->m_functionWrite,R0);
    if (R1 != 0xffffffff) {
      if (this->m_functionWrite == (FunctionBody *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
        if (!bVar2) goto LAB_0089b01b;
        *puVar5 = 0;
      }
      R1_00 = FunctionBody::MapRegSlot(this->m_functionWrite,R1);
      if (R2 != 0xffffffff) {
        if (this->m_functionWrite == (FunctionBody *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                      ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
          if (!bVar2) goto LAB_0089b01b;
          *puVar5 = 0;
        }
        R2_00 = FunctionBody::MapRegSlot(this->m_functionWrite,R2);
        local_34 = 0;
        bVar2 = DynamicProfileInfo::IsEnabled(FloatTypeSpecPhase,this->m_functionWrite);
        if ((bVar2) && ((local_32[0] == Rem_A || (local_32[0] == Div_A)))) {
          TVar4 = this->m_functionWrite->profiledDivOrRemCount;
          if (TVar4 == 0xffff) goto LAB_0089aefd;
          this->m_functionWrite->profiledDivOrRemCount = TVar4 + 1;
LAB_0089af20:
          local_34 = TVar4;
          OpCodeUtil::ConvertNonCallOpToProfiled(local_32);
          bVar2 = true;
        }
        else {
LAB_0089aefd:
          if (local_32[0] == IsIn) {
            TVar4 = this->m_functionWrite->profiledLdElemCount;
            if (TVar4 != 0xffff) {
              this->m_functionWrite->profiledLdElemCount = TVar4 + 1;
              goto LAB_0089af20;
            }
          }
          bVar2 = false;
        }
        bVar3 = TryWriteReg3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                          (this,local_32[0],R0_00,R1_00,R2_00);
        if (!bVar3) {
          bVar3 = TryWriteReg3<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                            (this,local_32[0],R0_00,R1_00,R2_00);
          if (!bVar3) {
            local_40 = R0_00;
            local_3c = R1_00;
            local_38 = R2_00;
            Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,local_32[0],this);
            Data::Write(&this->m_byteCodeData,&local_40,0xc);
          }
        }
        if (bVar2) {
          Data::Write(&this->m_byteCodeData,&local_34,2);
        }
        return;
      }
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar5 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                              ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
  if (bVar2) {
    *puVar5 = 0;
    Throw::InternalError();
  }
LAB_0089b01b:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void ByteCodeWriter::Reg3(OpCode op, RegSlot R0, RegSlot R1, RegSlot R2)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::Reg3);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        R0 = ConsumeReg(R0);
        R1 = ConsumeReg(R1);
        R2 = ConsumeReg(R2);

        ProfileId profileId = 0;
        bool isProfiled = false;
        if ((DoDynamicProfileOpcode(FloatTypeSpecPhase) && (op == Js::OpCode::Div_A || op == Js::OpCode::Rem_A)) &&
            this->m_functionWrite->AllocProfiledDivOrRem(&profileId))
        {
            isProfiled = true;
            OpCodeUtil::ConvertNonCallOpToProfiled(op);
        }
        else if (op == Js::OpCode::IsIn && this->m_functionWrite->AllocProfiledLdElemId(&profileId))
        {
            isProfiled = true;
            OpCodeUtil::ConvertNonCallOpToProfiled(op);
        }

        MULTISIZE_LAYOUT_WRITE(Reg3, op, R0, R1, R2);
        if (isProfiled)
        {
            m_byteCodeData.Encode(&profileId, sizeof(Js::ProfileId));
        }
    }